

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O1

void Amap_ManMatchNode(Amap_Man_t *p,Amap_Obj_t *pNode,int fFlow,int fRefs)

{
  size_t __n;
  ushort uVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  Amap_Cut_t **ppAVar6;
  Amap_Cut_t *pAVar7;
  uint uVar8;
  ulong uVar9;
  Amap_Cut_t *pAVar10;
  uint uVar11;
  int iVar12;
  Amap_Set_t *pAVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  Amap_Mat_t MD;
  Amap_Mat_t MA;
  Amap_Mat_t local_a8;
  int local_80;
  float local_7c;
  Amap_Cut_t *local_78;
  Amap_Set_t *pAStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Amap_Cut_t *local_58;
  Amap_Set_t *pAStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong local_38;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58 = (Amap_Cut_t *)0x0;
  pAStack_50 = (Amap_Set_t *)0x0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = (Amap_Cut_t *)0x0;
  pAStack_70 = (Amap_Set_t *)0x0;
  local_a8.Area = 0.0;
  local_a8.AveFan = 0.0;
  local_a8.Delay = 0.0;
  local_a8._28_4_ = 0;
  local_a8.pCut = (Amap_Cut_t *)0x0;
  local_a8.pSet = (Amap_Set_t *)0x0;
  if (fRefs == 0) {
    fVar16 = (float)pNode->nRefs;
  }
  else {
    fVar16 = (pNode->EstRefs + pNode->EstRefs + (float)(pNode->nFouts[1] + pNode->nFouts[0])) / 3.0;
  }
  pNode->EstRefs = fVar16;
  local_80 = fRefs;
  if ((fRefs != 0) &&
     (iVar4 = pNode->nFouts[1] + pNode->nFouts[0],
     iVar4 != 0 && SCARRY4(pNode->nFouts[1],pNode->nFouts[0]) == iVar4 < 0)) {
    Amap_CutAreaDeref(p,&pNode->Best);
  }
  uVar9 = 0;
  local_78 = (Amap_Cut_t *)0x0;
  local_58 = (Amap_Cut_t *)0x0;
  if (0xfff < *(uint *)&pNode->field_0x8) {
    pAVar10 = (Amap_Cut_t *)(pNode->field_11).pData;
    do {
      local_38 = uVar9;
      if ((ulong)*(ushort *)pAVar10 != 0) {
        for (pAVar13 = p->pLib->pNodes[*(ushort *)pAVar10].pSets; pAVar13 != (Amap_Set_t *)0x0;
            pAVar13 = pAVar13->pNext) {
          local_a8.Area = 0.0;
          local_a8.AveFan = 0.0;
          local_a8.Delay = 0.0;
          local_a8._28_4_ = 0;
          uVar1 = *(ushort *)&pAVar13->field_0x8;
          pVVar2 = p->pLib->vGates;
          local_a8.pCut = pAVar10;
          local_a8.pSet = pAVar13;
          if (fFlow == 0) {
            if (pVVar2->nSize <= (int)(uint)uVar1) goto LAB_003b0d54;
            uVar5 = *(uint *)((long)pVVar2->pArray[uVar1] + 0x38) >> 0x18;
            uVar8 = (uint)*pAVar10 >> 0x11;
            if (uVar5 != uVar8) {
              __assert_fail("pGate->nPins == pM->pCut->nFans",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMatch.c"
                            ,0x1ad,
                            "void Amap_ManMatchGetExacts(Amap_Man_t *, Amap_Obj_t *, Amap_Mat_t *)")
              ;
            }
            local_a8.AveFan = 0.0;
            local_a8.Delay = 0.0;
            if (0x1ffff < (uint)*pAVar10) {
              uVar9 = 0;
              do {
                if ((pAVar13->Ins[uVar9] < '\0') ||
                   (uVar11 = *(uint *)((long)&pAVar10[1].field_0x0 +
                                      (ulong)((byte)pAVar13->Ins[uVar9] & 0xfffffffe) * 2),
                   (int)uVar11 < 0)) goto LAB_003b0d15;
                uVar11 = uVar11 >> 1;
                if (p->vObjs->nSize <= (int)uVar11) goto LAB_003b0d54;
                pvVar3 = p->vObjs->pArray[uVar11];
                iVar4 = (int)local_a8.Delay;
                if ((int)local_a8.Delay <= (int)*(float *)((long)pvVar3 + 0x50)) {
                  iVar4 = (int)*(float *)((long)pvVar3 + 0x50);
                }
                local_a8.Delay = (float)iVar4;
                local_a8.AveFan =
                     local_a8.AveFan +
                     (float)(*(int *)((long)pvVar3 + 0x30) + *(int *)((long)pvVar3 + 0x2c));
                uVar9 = uVar9 + 1;
              } while (uVar8 != uVar9);
            }
            local_a8.AveFan = local_a8.AveFan / (float)uVar5;
            local_a8.Delay = local_a8.Delay + 1.0;
            local_7c = Amap_CutAreaRef(p,&local_a8);
            fVar16 = Amap_CutAreaDeref(p,&local_a8);
            if (fVar16 <= local_7c - p->fEpsilonInternal) {
              __assert_fail("aResult > aResult2 - p->fEpsilonInternal",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMatch.c"
                            ,0x14f,
                            "float Amap_CutAreaDerefed(Amap_Man_t *, Amap_Obj_t *, Amap_Mat_t *)");
            }
            if (local_7c + p->fEpsilonInternal <= fVar16) {
              __assert_fail("aResult < aResult2 + p->fEpsilonInternal",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMatch.c"
                            ,0x150,
                            "float Amap_CutAreaDerefed(Amap_Man_t *, Amap_Obj_t *, Amap_Mat_t *)");
            }
            uVar5 = (*(uint *)&pAVar13->field_0x8 ^ (uint)*pAVar10) >> 0x10 & 1;
            local_a8.Area = fVar16;
            if ((pNode->nFouts[uVar5] == 0) && (0 < pNode->nFouts[uVar5 ^ 1])) {
              local_a8.Area = fVar16 + p->fAreaInv;
            }
          }
          else {
            if (pVVar2->nSize <= (int)(uint)uVar1) {
LAB_003b0d54:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            uVar5 = *(uint *)((long)pVVar2->pArray[uVar1] + 0x38) >> 0x18;
            uVar8 = (uint)*pAVar10 >> 0x11;
            if (uVar5 != uVar8) {
              __assert_fail("pGate->nPins == pM->pCut->nFans",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMatch.c"
                            ,0x188,"void Amap_ManMatchGetFlows(Amap_Man_t *, Amap_Mat_t *)");
            }
            local_a8.Area = (float)*(double *)((long)pVVar2->pArray[uVar1] + 0x20);
            local_a8.AveFan = 0.0;
            local_a8.Delay = 0.0;
            if (0x1ffff < (uint)*pAVar10) {
              uVar9 = 0;
              do {
                if ((pAVar13->Ins[uVar9] < '\0') ||
                   (uVar11 = *(uint *)((long)&pAVar10[1].field_0x0 +
                                      (ulong)((byte)pAVar13->Ins[uVar9] & 0xfffffffe) * 2),
                   (int)uVar11 < 0)) {
LAB_003b0d15:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                                ,0x10c,"int Abc_Lit2Var(int)");
                }
                uVar11 = uVar11 >> 1;
                if (p->vObjs->nSize <= (int)uVar11) goto LAB_003b0d54;
                pvVar3 = p->vObjs->pArray[uVar11];
                iVar4 = (int)*(float *)((long)pvVar3 + 0x50);
                if ((int)*(float *)((long)pvVar3 + 0x50) < (int)local_a8.Delay) {
                  iVar4 = (int)local_a8.Delay;
                }
                fVar16 = *(float *)((long)pvVar3 + 0x48);
                iVar12 = *(int *)((long)pvVar3 + 0x30) + *(int *)((long)pvVar3 + 0x2c);
                if (iVar12 != 0) {
                  fVar16 = fVar16 / *(float *)((long)pvVar3 + 0x28);
                }
                local_a8.Area = local_a8.Area + fVar16;
                local_a8.Delay = (float)iVar4;
                local_a8.AveFan = local_a8.AveFan + (float)iVar12;
                uVar9 = uVar9 + 1;
              } while (uVar8 != uVar9);
            }
            local_a8.AveFan = local_a8.AveFan / (float)uVar5;
            local_a8.Delay = local_a8.Delay + 1.0;
          }
          if (local_78 == (Amap_Cut_t *)0x0) {
LAB_003b0b00:
            local_68 = CONCAT44(local_a8.AveFan,local_a8.Area);
            uStack_60 = CONCAT44(local_a8._28_4_,local_a8.Delay);
            local_78 = local_a8.pCut;
            pAStack_70 = local_a8.pSet;
          }
          else {
            fVar16 = p->pPars->fEpsilon;
            if ((local_a8.Delay - fVar16 <= (float)uStack_60) &&
               ((local_a8.Delay + fVar16 < (float)uStack_60 ||
                ((local_a8.Area - fVar16 <= (float)local_68 &&
                 ((local_a8.Area + fVar16 < (float)local_68 ||
                  (local_68._4_4_ <= local_a8.AveFan - fVar16)))))))) goto LAB_003b0b00;
          }
          if (local_58 == (Amap_Cut_t *)0x0) {
LAB_003b0b44:
            local_48 = CONCAT44(local_a8.AveFan,local_a8.Area);
            uStack_40 = CONCAT44(local_a8._28_4_,local_a8.Delay);
            local_58 = local_a8.pCut;
            pAStack_50 = local_a8.pSet;
          }
          else {
            fVar16 = p->pPars->fEpsilon;
            if ((local_a8.Area - fVar16 <= (float)local_48) &&
               ((local_a8.Area + fVar16 < (float)local_48 ||
                ((local_48._4_4_ <= local_a8.AveFan - fVar16 &&
                 ((local_48._4_4_ < local_a8.AveFan + fVar16 ||
                  (local_a8.Delay - fVar16 <= (float)uStack_40)))))))) goto LAB_003b0b44;
          }
        }
      }
      uVar5 = (int)local_38 + 1;
      uVar9 = (ulong)uVar5;
      pAVar10 = pAVar10 + (ulong)((uint)*pAVar10 >> 0x11) + 1;
    } while (uVar5 < *(uint *)&pNode->field_0x8 >> 0xc);
  }
  fVar14 = (float)local_48 - (float)local_68;
  fVar16 = -fVar14;
  if (-fVar14 <= fVar14) {
    fVar16 = fVar14;
  }
  fVar15 = (float)uStack_40 - (float)uStack_60;
  fVar14 = -fVar15;
  if (-fVar15 <= fVar15) {
    fVar14 = fVar15;
  }
  ppAVar6 = &local_58;
  if (fVar16 / (float)local_68 < (fVar14 * p->pPars->fADratio) / (float)uStack_40) {
    ppAVar6 = &local_78;
  }
  *(ulong *)pNode =
       *(ulong *)pNode & 0x7fffffffffffffff |
       (ulong)(((uint)ppAVar6[1][2] ^ (uint)**ppAVar6) >> 0x10) << 0x3f;
  pAVar13 = (Amap_Set_t *)ppAVar6[1];
  pAVar10 = ppAVar6[2];
  pAVar7 = ppAVar6[3];
  (pNode->Best).pCut = *ppAVar6;
  (pNode->Best).pSet = pAVar13;
  *(Amap_Cut_t **)&(pNode->Best).Area = pAVar10;
  *(Amap_Cut_t **)&(pNode->Best).Delay = pAVar7;
  pAVar10 = (pNode->Best).pCut;
  __n = (ulong)((uint)*pAVar10 >> 0x11) * 4 + 4;
  pAVar7 = (Amap_Cut_t *)Aig_MmFlexEntryFetch(p->pMemCutBest,(int)__n);
  memcpy(pAVar7,pAVar10,__n);
  (pNode->Best).pCut = pAVar7;
  if ((local_80 != 0) &&
     (iVar4 = pNode->nFouts[1] + pNode->nFouts[0],
     iVar4 != 0 && SCARRY4(pNode->nFouts[1],pNode->nFouts[0]) == iVar4 < 0)) {
    Amap_CutAreaRef(p,&pNode->Best);
    return;
  }
  return;
}

Assistant:

void Amap_ManMatchNode( Amap_Man_t * p, Amap_Obj_t * pNode, int fFlow, int fRefs )
{
    int fVerbose = 0; //(pNode->Level == 2 || pNode->Level == 4);
    int fVeryVerbose = fVerbose;

    Amap_Mat_t MA = {0}, MD = {0}, M = {0};
    Amap_Mat_t * pMBestA = &MA, * pMBestD = &MD, * pMThis = &M, * pMBest;
    Amap_Cut_t * pCut;
    Amap_Set_t * pSet;
    Amap_Nod_t * pNod;
    int i;

    if ( fRefs )
        pNode->EstRefs = (float)((2.0 * pNode->EstRefs + Amap_ObjRefsTotal(pNode)) / 3.0);
    else
        pNode->EstRefs = (float)pNode->nRefs;
    if ( fRefs && Amap_ObjRefsTotal(pNode) > 0 )
        Amap_CutAreaDeref( p, &pNode->Best );

    if ( fVerbose )
        printf( "\nNode %d (%d)\n", pNode->Id, pNode->Level );

    pMBestA->pCut = pMBestD->pCut = NULL;
    Amap_NodeForEachCut( pNode, pCut, i )
    {
        if ( pCut->iMat == 0 )
            continue;
        pNod = Amap_LibNod( p->pLib, pCut->iMat );
        Amap_LibNodeForEachSet( pNod, pSet )
        {
            Amap_ManMatchStart( pMThis, pCut, pSet );
            if ( fFlow )
                Amap_ManMatchGetFlows( p, pMThis );
            else
                Amap_ManMatchGetExacts( p, pNode, pMThis );
            if ( pMBestD->pCut == NULL || Amap_CutCompareDelay(p, pMBestD, pMThis) == 1 )
                *pMBestD = *pMThis;
            if ( pMBestA->pCut == NULL || Amap_CutCompareArea(p, pMBestA, pMThis) == 1 )
                *pMBestA = *pMThis;

            if ( fVeryVerbose ) 
            {
                printf( "Cut %2d (%d) :  ", i, pCut->nFans );
                printf( "Gate %10s  ",      Amap_LibGate(p->pLib, pMThis->pSet->iGate)->pName );
                printf( "%s  ",             pMThis->pSet->fInv ? "inv" : "   " );
                printf( "Delay %5.2f  ",    pMThis->Delay );
                printf( "Area %5.2f  ",     pMThis->Area );
                printf( "\n" );
            }
        }
    }

    if ( Abc_AbsFloat(pMBestA->Area - pMBestD->Area) / pMBestD->Area >= p->pPars->fADratio * Abc_AbsFloat(pMBestA->Delay - pMBestD->Delay) / pMBestA->Delay )
        pMBest = pMBestA;
    else
        pMBest = pMBestD;

    if ( fVerbose )
    {
        printf( "BEST MATCHA:  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBestA->pSet->iGate)->pName );
        printf( "%s  ",           pMBestA->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBestA->Delay );
        printf( "Area %5.2f  ",   pMBestA->Area );
        printf( "\n" ); 

        printf( "BEST MATCHD:  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBestD->pSet->iGate)->pName );
        printf( "%s  ",           pMBestD->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBestD->Delay );
        printf( "Area %5.2f  ",   pMBestD->Area );
        printf( "\n" ); 

        printf( "BEST MATCH :  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBest->pSet->iGate)->pName );
        printf( "%s  ",           pMBest->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBest->Delay );
        printf( "Area %5.2f  ",   pMBest->Area );
        printf( "\n" ); 
    }

    pNode->fPolar = pMBest->pCut->fInv ^ pMBest->pSet->fInv;
    pNode->Best = *pMBest;
    pNode->Best.pCut = Amap_ManDupCut( p, pNode->Best.pCut );
    if ( fRefs && Amap_ObjRefsTotal(pNode) > 0 )
        Amap_CutAreaRef( p, &pNode->Best );
}